

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_combine.h
# Opt level: O0

size_t spvtools::utils::hash_combine<unsigned_int>
                 (size_t hash,vector<unsigned_int,_std::allocator<unsigned_int>_> *vals)

{
  bool bVar1;
  reference val_00;
  uint *val;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vals_local;
  size_t hash_local;
  
  __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(vals);
  val = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(vals);
  vals_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)hash;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&val);
    if (!bVar1) break;
    val_00 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end0);
    vals_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 hash_combine<unsigned_int>((size_t)vals_local,val_00);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end0);
  }
  return (size_t)vals_local;
}

Assistant:

inline size_t hash_combine(std::size_t hash, const std::vector<T>& vals) {
  for (const T& val : vals) {
    hash = hash_combine(hash, val);
  }
  return hash;
}